

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdditionGeneralizationImpl.hpp
# Opt level: O2

void __thiscall
Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::RealConstantType>_>::
MonomSet(MonomSet<Kernel::NumTraits<Kernel::RealConstantType>_> *this,Variable var,
        Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
        *poly)

{
  Option<const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&> OVar1;
  undefined1 local_c0 [8];
  StlIter __begin0;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> local_a8;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> local_80;
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
  local_50;
  
  local_a8._cursor = (Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x0;
  local_a8._end = (Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x0;
  local_a8._capacity = 0;
  local_a8._stack = (Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x0;
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::Stack
            (&this->_cancellable,&local_a8);
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::~Stack(&local_a8);
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::reserve
            (&this->_cancellable,
             (ulong)((int)(((long)(poly->_ptr->_summands)._cursor -
                           (long)(poly->_ptr->_summands)._stack) / 0x30) - 1));
  local_50._iter._func.a = &poly->_ptr->_summands;
  local_50._iter._inner._to =
       ((long)(local_50._iter._func.a)->_cursor - (long)(local_50._iter._func.a)->_stack) / 0x30;
  local_50._iter._inner._next = 0;
  local_50._iter._inner._from = 0;
  Lib::
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
  ::StlIter::StlIter(&__begin0,&local_50);
  while (OVar1.super_OptionBase<const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>
         .super_OptionBaseRef<const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_*>.
         _elem = __begin0._cur.
                 super_OptionBase<const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>
                 .
                 super_OptionBaseRef<const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_*>
                 ._elem,
        (OptionBaseRef<const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_*>)
        __begin0._cur.
        super_OptionBase<const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>.
        super_OptionBaseRef<const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_*>.
        _elem != (OptionBaseRef<const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_*>
                 )0x0) {
    Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::tryVar
              ((Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)local_c0);
    if ((local_c0[0] == '\0') || (local_c0._4_4_ != var._num)) {
      Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::Monom
                (&local_80,
                 (Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)
                 OVar1.
                 super_OptionBase<const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>
                 .
                 super_OptionBaseRef<const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_*>
                 ._elem);
      Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::push
                (&this->_cancellable,&local_80);
      Kernel::RationalConstantType::~RationalConstantType((RationalConstantType *)&local_80);
    }
    Lib::
    IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
    ::StlIter::operator++(&__begin0);
  }
  return;
}

Assistant:

MonomSet(Variable var, Perfect<Polynom<NumTraits>> poly) : MonomSet(decltype(_cancellable)()) 
  {
    _cancellable.reserve(poly->nSummands() - 1);
    for (auto const& monom : poly->iterSummands()) {
      if (monom.tryVar() != some(var)) {
        _cancellable.push(monom);
      }
    }
  }